

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O0

ChannelList *
anon_unknown.dwarf_1a47d9::setupBuffer
          (Header *hdr,char **channels,char **passivechannels,PixelType *pt,FrameBuffer *buf,
          FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,bool writing)

{
  char *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Box2i *pBVar6;
  reference pvVar7;
  reference pvVar8;
  long in_RCX;
  long in_RDX;
  ChannelList *in_RDI;
  long in_R8;
  bool bVar9;
  float fVar10;
  int in_stack_00000018;
  byte in_stack_00000020;
  Slice *in_stack_00000070;
  char *in_stack_00000078;
  ChannelList *in_stack_00000080;
  char *pre_offset;
  int bank;
  PixelType type;
  int i_1;
  int first_pixel_index;
  int bytes_per_bank_row;
  int bytes_per_row;
  char *offset;
  half v;
  unsigned_short values;
  int i;
  int chan;
  char *write_ptr;
  int size;
  int samples;
  int bytes_per_bank;
  int chans;
  int passivechans;
  bool has32BitValue;
  int bytes_per_pixel;
  int activechans;
  Box2i dw;
  ChannelList *chanlist;
  undefined4 in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  undefined4 in_stack_fffffffffffffdd0;
  int in_stack_fffffffffffffdd4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  size_type __n;
  reference local_1c0;
  PixelType local_1a4;
  float *local_1a0;
  int in_stack_fffffffffffffe74;
  Slice local_170;
  char *local_138;
  Slice local_130;
  Slice local_f8;
  int local_c0;
  Channel local_b0;
  PixelType local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  undefined1 local_89;
  char *local_88;
  unsigned_short local_7e;
  half local_7c;
  unsigned_short local_7a;
  int local_78;
  int local_74;
  float *local_70;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  char local_4d;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  byte local_31;
  long local_28;
  long local_20;
  long local_18;
  
  local_31 = in_stack_00000020 & 1;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  Imf_2_5::Header::dataWindow((Header *)0x1e695f);
  Imath_2_5::Box<Imath_2_5::Vec2<int>_>::Box
            ((Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdd4,in_stack_fffffffffffffdd0),
             (Box<Imath_2_5::Vec2<int>_> *)
             CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_48 = 0;
  local_4c = 0;
  local_4d = '\0';
  while (*(long *)(local_18 + (long)local_48 * 8) != 0) {
    if (local_28 == 0) {
      local_4c = local_4c + 2;
    }
    else {
      iVar2 = *(int *)(local_28 + (long)local_48 * 4);
      if (iVar2 != 0) {
        if (iVar2 == 1) {
          local_4c = local_4c + 2;
          goto LAB_001e6a65;
        }
        if (iVar2 != 2) {
          std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
          exit(1);
        }
      }
      local_4c = alignToFour<int>(local_4c);
      local_4c = local_4c + 4;
      local_4d = '\x01';
    }
LAB_001e6a65:
    local_48 = local_48 + 1;
  }
  local_54 = 0;
  do {
    bVar9 = false;
    if (local_20 != 0) {
      bVar9 = *(long *)(local_20 + (long)local_54 * 8) != 0;
    }
    if (!bVar9) {
      if (local_4d != '\0') {
        local_4c = alignToFour<int>(local_4c);
      }
      local_58 = local_48 + local_54;
      local_5c = local_4c / in_stack_00000018;
      pBVar6 = Imf_2_5::Header::dataWindow((Header *)0x1e6bfc);
      iVar2 = (pBVar6->max).x + 1;
      pBVar6 = Imf_2_5::Header::dataWindow((Header *)0x1e6c16);
      iVar3 = iVar2 - (pBVar6->min).x;
      pBVar6 = Imf_2_5::Header::dataWindow((Header *)0x1e6c36);
      iVar4 = (pBVar6->max).y + 1;
      pBVar6 = Imf_2_5::Header::dataWindow((Header *)0x1e6c50);
      local_60 = iVar3 * (iVar4 - (pBVar6->min).y) * local_58;
      local_64 = local_60 * local_4c;
      if ((local_31 & 1) == 0) {
        std::vector<char,_std::allocator<char>_>::resize
                  (in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
      else {
        std::vector<char,_std::allocator<char>_>::resize
                  (in_stack_fffffffffffffdf0,
                   CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8));
      }
      if ((local_31 & 1) == 0) {
        local_1a0 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                       ((vector<char,_std::allocator<char>_> *)
                                        (anonymous_namespace)::readingBuffer,0);
      }
      else {
        local_1a0 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                       ((vector<char,_std::allocator<char>_> *)
                                        (anonymous_namespace)::writingBuffer,0);
      }
      local_70 = local_1a0;
      local_74 = 0;
      for (local_78 = 0; local_78 < local_60; local_78 = local_78 + 1) {
        std::numeric_limits<unsigned_short>::max();
        iVar5 = random_int(in_stack_fffffffffffffdd4);
        local_7a = (unsigned_short)iVar5;
        half::setBits(&local_7c,local_7a);
        if ((local_28 == 0) || (*(int *)(local_28 + (long)local_74 * 4) == 1)) {
          local_7e = local_7c._h;
          *(unsigned_short *)local_70 = local_7c._h;
          local_70 = (float *)((long)local_70 + 2);
        }
        else {
          local_70 = (float *)(anonymous_namespace)::alignToFour<char_const*>((char *)local_70);
          fVar10 = half::operator_cast_to_float(&local_7c);
          *local_70 = fVar10;
          local_70 = local_70 + 1;
        }
        local_74 = local_74 + 1;
        if (local_74 == local_58) {
          local_74 = 0;
        }
      }
      if ((local_31 & 1) == 0) {
        std::vector<char,_std::allocator<char>_>::operator=
                  ((vector<char,_std::allocator<char>_> *)CONCAT44(in_stack_fffffffffffffe74,iVar3),
                   (vector<char,_std::allocator<char>_> *)CONCAT44(iVar4,iVar2));
      }
      local_88 = (char *)0x0;
      local_89 = 0;
      Imf_2_5::ChannelList::ChannelList((ChannelList *)0x1e6e7e);
      local_90 = local_4c * ((local_3c + 1) - local_44);
      local_94 = local_90 / in_stack_00000018;
      local_98 = local_90 * local_40 + local_5c * local_44;
      local_9c = 0;
      do {
        if (local_58 <= local_9c) {
          return in_RDI;
        }
        if (local_28 == 0) {
          local_1a4 = HALF;
        }
        else {
          local_1a4 = *(PixelType *)(local_28 + (long)local_9c * 4);
        }
        local_a0 = local_1a4;
        if ((local_9c < local_48) && ((local_31 & 1) != 0)) {
          Imf_2_5::Channel::Channel(&local_b0,local_1a4,1,1,false);
          Imf_2_5::ChannelList::insert
                    (in_stack_00000080,in_stack_00000078,(Channel *)in_stack_00000070);
        }
        if (local_9c % (local_58 / in_stack_00000018) == 0) {
          local_c0 = local_9c / (local_58 / in_stack_00000018);
          if ((local_31 & 1) == 0) {
            local_1c0 = std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)
                                   (anonymous_namespace)::readingBuffer,0);
          }
          else {
            local_1c0 = std::vector<char,_std::allocator<char>_>::operator[]
                                  ((vector<char,_std::allocator<char>_> *)
                                   (anonymous_namespace)::writingBuffer,0);
          }
          local_88 = local_1c0 + ((long)(local_c0 * local_94) - (long)local_98);
        }
        if ((local_a0 == FLOAT) || (local_a0 == UINT)) {
          local_88 = (anonymous_namespace)::alignToFour<char*>(local_88);
        }
        if (local_9c < local_48) {
          Imf_2_5::Slice::Slice
                    (&local_f8,local_a0,local_88,(long)local_5c,(long)local_90,1,1,
                     (double)(local_9c + 100),false,false);
          Imf_2_5::FrameBuffer::insert
                    ((FrameBuffer *)in_stack_00000080,in_stack_00000078,in_stack_00000070);
        }
        else if ((local_31 & 1) == 0) {
          Imf_2_5::Slice::Slice
                    (&local_130,local_a0,local_88,(long)local_5c,(long)local_90,1,1,0.4,false,false)
          ;
          Imf_2_5::FrameBuffer::insert
                    ((FrameBuffer *)in_stack_00000080,in_stack_00000078,in_stack_00000070);
          pcVar1 = local_88;
          __n = 0;
          pvVar7 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)
                              (anonymous_namespace)::readingBuffer,0);
          pvVar8 = std::vector<char,_std::allocator<char>_>::operator[]
                             ((vector<char,_std::allocator<char>_> *)
                              (anonymous_namespace)::preReadBuffer,__n);
          local_138 = pvVar8 + ((long)pcVar1 - (long)pvVar7);
          Imf_2_5::Slice::Slice
                    (&local_170,local_a0,local_138,(long)local_5c,(long)local_90,1,1,0.4,false,false
                    );
          Imf_2_5::FrameBuffer::insert
                    ((FrameBuffer *)in_stack_00000080,in_stack_00000078,in_stack_00000070);
        }
        if (local_a0 == HALF) {
          local_88 = local_88 + 2;
        }
        else {
          if (local_a0 != FLOAT) {
            std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
            exit(1);
          }
          local_88 = local_88 + 4;
        }
        local_9c = local_9c + 1;
      } while( true );
    }
    if (local_28 == 0) {
      local_4c = local_4c + 2;
    }
    else {
      in_stack_fffffffffffffe74 = *(int *)(local_28 + (long)(local_54 + local_48) * 4);
      if (in_stack_fffffffffffffe74 != 0) {
        if (in_stack_fffffffffffffe74 == 1) {
          local_4c = local_4c + 2;
          goto LAB_001e6b91;
        }
        if (in_stack_fffffffffffffe74 != 2) {
          std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
          exit(1);
        }
      }
      local_4c = alignToFour<int>(local_4c);
      local_4c = local_4c + 4;
      local_4d = '\x01';
    }
LAB_001e6b91:
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const char * const *passivechannels, // NULL terminated list of channels to write
             const PixelType* pt,     // type of each channel, or NULL for all HALF
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             FrameBuffer& prereadbuf, // channels which aren't being read - indexes into the preread buffer
             FrameBuffer& postreadbuf, // channels which aren't being read - indexes into the postread buffer
             int banks,                    // number of banks - channels within each bank are interleaved, banks are scanline interleaved
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    int activechans = 0;
    int bytes_per_pixel =0;
    bool has32BitValue = false;
    while (channels[activechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                    
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        activechans++;
    }

    
    int passivechans=0;
    while (passivechannels!=NULL && passivechannels[passivechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[passivechans+activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        passivechans++;
    }
    
    if(has32BitValue)
    {
        bytes_per_pixel = alignToFour(bytes_per_pixel);
    }

   int chans = activechans+passivechans;

    
    int bytes_per_bank = bytes_per_pixel/banks;
    
    int samples = (hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  (hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*chans;

    int size = samples*bytes_per_pixel;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels
     int chan=0;
     for (int i=0;i<samples;i++)
     {
         unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
         half v;
         v.setBits(values);
         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
             write_ptr+=2;
         }
         else
         {
             write_ptr = alignToFour(write_ptr);
             *(float*)write_ptr = float(v);
             
             write_ptr+=4;
         }
         chan++;
         if (chan==chans)
         {
             chan=0;
         }
     
     }

     if (!writing)
     {
         //take a copy of the buffer as it was before being read
         preReadBuffer = readingBuffer;
     }
     
    char* offset=NULL;

    ChannelList chanlist;

    int bytes_per_row = bytes_per_pixel*(dw.max.x+1-dw.min.x);
    int bytes_per_bank_row = bytes_per_row/banks;
    
    int first_pixel_index = bytes_per_row*dw.min.y+bytes_per_bank*dw.min.x;
    
    for (int i=0;i<chans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];
        if (i<activechans && writing)
        {
            chanlist.insert(channels[i],type);
        }


        if (i % (chans/banks) ==0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans/banks);
            offset = (writing ? &writingBuffer[0] :
                                &readingBuffer[0]) + bank*bytes_per_bank_row - first_pixel_index;
        }
       

         if(type==FLOAT || type==UINT)
         {
           offset = alignToFour(offset);
         }
 
        if (i<activechans)
        {
            
            buf.insert (channels[i],
                        Slice (type,
                               offset,
                               bytes_per_bank,
                               bytes_per_row,
                               1,1,100+i));
        }
        else
        {
            if (!writing)
            {
                
                postreadbuf.insert (passivechannels[i-activechans],
                                    Slice (type,
                                           offset,
                                           bytes_per_bank,
                                           bytes_per_row,
                                           1,1,0.4));

                char * pre_offset = offset-&readingBuffer[0]+&preReadBuffer[0];
 
                prereadbuf.insert (passivechannels[i-activechans],
                                   Slice (type,
                                          pre_offset,
                                          bytes_per_bank,
                                          bytes_per_row,
                                          1,1,0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF :
                offset+=2;
                break;
            case IMF::FLOAT :
                offset+=4;
                break;
            default :
                cout << "Unexpected Pixel Type\n";
                exit(1);
        
        }
    }

    return chanlist;
}